

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall cmGeneratorTarget::MacOSXUseInstallNameDir(cmGeneratorTarget *this)

{
  bool bVar1;
  char *val;
  cmGlobalGenerator *this_00;
  string *target;
  allocator<char> local_81;
  string local_80;
  byte local_59;
  PolicyStatus local_58;
  bool use_install_name;
  PolicyStatus cmp0068;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *build_with_install_name;
  cmGeneratorTarget *this_local;
  
  build_with_install_name = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"BUILD_WITH_INSTALL_NAME_DIR",&local_41);
  val = GetProperty(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  local_20 = val;
  if (val == (char *)0x0) {
    local_58 = GetPolicyStatusCMP0068(this);
    if (local_58 == NEW) {
      this_local._7_1_ = false;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"BUILD_WITH_INSTALL_RPATH",&local_81);
      bVar1 = GetPropertyAsBool(this,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator(&local_81);
      local_59 = bVar1;
      if ((bVar1) && (local_58 == WARN)) {
        this_00 = cmLocalGenerator::GetGlobalGenerator(this->LocalGenerator);
        target = GetName_abi_cxx11_(this);
        cmGlobalGenerator::AddCMP0068WarnTarget(this_00,target);
      }
      this_local._7_1_ = (bool)(local_59 & 1);
    }
  }
  else {
    this_local._7_1_ = cmSystemTools::IsOn(val);
  }
  return this_local._7_1_;
}

Assistant:

bool cmGeneratorTarget::MacOSXUseInstallNameDir() const
{
  const char* build_with_install_name =
    this->GetProperty("BUILD_WITH_INSTALL_NAME_DIR");
  if (build_with_install_name) {
    return cmSystemTools::IsOn(build_with_install_name);
  }

  cmPolicies::PolicyStatus cmp0068 = this->GetPolicyStatusCMP0068();
  if (cmp0068 == cmPolicies::NEW) {
    return false;
  }

  bool use_install_name = this->GetPropertyAsBool("BUILD_WITH_INSTALL_RPATH");

  if (use_install_name && cmp0068 == cmPolicies::WARN) {
    this->LocalGenerator->GetGlobalGenerator()->AddCMP0068WarnTarget(
      this->GetName());
  }

  return use_install_name;
}